

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bio.c
# Opt level: O0

int bio_flush(opj_bio_t *bio)

{
  int iVar1;
  opj_bio_t *in_RDI;
  int local_4;
  
  in_RDI->ct = 0;
  iVar1 = bio_byteout(in_RDI);
  if (iVar1 == 0) {
    if (in_RDI->ct == 7) {
      in_RDI->ct = 0;
      iVar1 = bio_byteout(in_RDI);
      if (iVar1 != 0) {
        return 1;
      }
    }
    local_4 = 0;
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int bio_flush(opj_bio_t *bio) {
	bio->ct = 0;
	if (bio_byteout(bio)) {
		return 1;
	}
	if (bio->ct == 7) {
		bio->ct = 0;
		if (bio_byteout(bio)) {
			return 1;
		}
	}
	return 0;
}